

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::FloatFunc3::applyMonotone
          (Interval *__return_storage_ptr__,FloatFunc3 *this,EvalContext *ctx,Interval *xi,
          Interval *yi,Interval *zi)

{
  bool bVar1;
  bool bVar2;
  undefined4 uVar3;
  EvalContext *pEVar4;
  undefined1 uVar5;
  char cVar6;
  Interval *tmp2__arg_;
  Interval *ret_arg_;
  double dVar7;
  double dVar8;
  double dVar9;
  ScopedRoundingMode point_ctx_;
  Interval local_140;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  EvalContext *local_100;
  double local_f8;
  double dStack_f0;
  Interval local_e0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  Interval *local_98;
  Interval local_90;
  Interval local_78;
  Interval local_60;
  Interval local_48;
  
  uVar5 = 0;
  local_60.m_hasNaN = false;
  dVar8 = INFINITY;
  dVar7 = -INFINITY;
  local_60.m_lo = INFINITY;
  local_60.m_hi = -INFINITY;
  local_78.m_hasNaN = false;
  local_78.m_lo = INFINITY;
  local_78.m_hi = -INFINITY;
  local_48.m_hasNaN = false;
  local_48.m_lo = INFINITY;
  local_48.m_hi = -INFINITY;
  local_f8 = xi->m_lo;
  if (local_f8 < xi->m_hi || local_f8 == xi->m_hi) {
    cVar6 = '\0';
    local_e0.m_hasNaN = false;
    dVar7 = INFINITY;
    dVar9 = -INFINITY;
    local_e0.m_lo = INFINITY;
    local_e0.m_hi = -INFINITY;
    local_90.m_hasNaN = false;
    local_90.m_lo = INFINITY;
    local_90.m_hi = -INFINITY;
    dVar8 = yi->m_lo;
    local_100 = ctx;
    if (dVar8 < yi->m_hi || dVar8 == yi->m_hi) {
      dVar7 = zi->m_lo;
      local_98 = __return_storage_ptr__;
      if (dVar7 < zi->m_hi || dVar7 == zi->m_hi) {
        local_128 = dVar7;
        local_118 = dVar8;
        point_ctx_.m_oldMode = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_f8,local_118,local_128,&local_140,this,ctx);
        bVar1 = local_140.m_hasNaN;
        local_a8 = local_140.m_lo;
        dStack_a0 = local_140.m_hi;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_f8,local_118,local_128,&local_140,this,ctx);
        bVar2 = local_140.m_hasNaN;
        local_b8 = local_140.m_lo;
        dStack_b0 = local_140.m_hi;
        tcu::ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
        local_128 = zi->m_hi;
        point_ctx_.m_oldMode = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        pEVar4 = local_100;
        (**(code **)(*(long *)this + 0x58))(local_f8,local_118,local_128,&local_140,this,local_100);
        uVar3 = local_140._0_4_;
        local_c8 = local_140.m_lo;
        dStack_c0 = local_140.m_hi;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_f8,local_118,local_128,&local_140,this,pEVar4);
        local_118 = (double)(~-(ulong)(local_a8 <= local_b8) & (ulong)local_b8 |
                            (ulong)local_a8 & -(ulong)(local_a8 <= local_b8));
        dStack_110 = (double)(~-(ulong)(dStack_b0 <= dStack_a0) & (ulong)dStack_b0 |
                             (ulong)dStack_a0 & -(ulong)(dStack_b0 <= dStack_a0));
        cVar6 = '\x01';
        if ((uVar3 & 1) == 0) {
          cVar6 = local_140.m_hasNaN;
        }
        if (((bVar1 | bVar2) & 1U) != 0) {
          cVar6 = '\x01';
        }
        local_128 = (double)(~-(ulong)(local_c8 <= local_140.m_lo) & (ulong)local_140.m_lo |
                            (ulong)local_c8 & -(ulong)(local_c8 <= local_140.m_lo));
        dStack_120 = (double)(~-(ulong)(local_140.m_hi <= dStack_c0) & (ulong)local_140.m_hi |
                             (ulong)dStack_c0 & -(ulong)(local_140.m_hi <= dStack_c0));
        tcu::ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
        local_e0.m_lo =
             (double)(~-(ulong)(local_118 <= local_128) & (ulong)local_128 |
                     (ulong)local_118 & -(ulong)(local_118 <= local_128));
        local_e0.m_hi =
             (double)(~-(ulong)(dStack_120 <= dStack_110) & (ulong)dStack_120 |
                     (ulong)dStack_110 & -(ulong)(dStack_120 <= dStack_110));
      }
      else {
        local_e0.m_lo = INFINITY;
        local_e0.m_hi = -INFINITY;
        cVar6 = '\0';
      }
      local_e0.m_hasNaN = (bool)cVar6;
      if (zi->m_hasNaN == true) {
        local_140.m_hasNaN = true;
        local_140.m_lo = INFINITY;
        local_140.m_hi = -INFINITY;
        tcu::Interval::operator|=(&local_e0,&local_140);
      }
      pEVar4 = local_100;
      dVar8 = zi->m_lo;
      if (dVar8 < zi->m_hi || dVar8 == zi->m_hi) {
        local_118 = yi->m_hi;
        local_128 = dVar8;
        point_ctx_.m_oldMode = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_f8,local_118,local_128,&local_140,this,pEVar4);
        bVar1 = local_140.m_hasNaN;
        local_a8 = local_140.m_lo;
        dStack_a0 = local_140.m_hi;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_f8,local_118,local_128,&local_140,this,pEVar4);
        bVar2 = local_140.m_hasNaN;
        local_b8 = local_140.m_lo;
        dStack_b0 = local_140.m_hi;
        tcu::ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
        local_128 = zi->m_hi;
        point_ctx_.m_oldMode = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_f8,local_118,local_128,&local_140,this,local_100);
        uVar3 = local_140._0_4_;
        local_c8 = local_140.m_lo;
        dStack_c0 = local_140.m_hi;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_f8,local_118,local_128,&local_140,this,local_100);
        local_f8 = (double)(~-(ulong)(local_a8 <= local_b8) & (ulong)local_b8 |
                           (ulong)local_a8 & -(ulong)(local_a8 <= local_b8));
        dStack_f0 = (double)(~-(ulong)(dStack_b0 <= dStack_a0) & (ulong)dStack_b0 |
                            (ulong)dStack_a0 & -(ulong)(dStack_b0 <= dStack_a0));
        cVar6 = '\x01';
        if ((uVar3 & 1) == 0) {
          cVar6 = local_140.m_hasNaN;
        }
        if (((bVar1 | bVar2) & 1U) != 0) {
          cVar6 = '\x01';
        }
        local_118 = (double)(~-(ulong)(local_c8 <= local_140.m_lo) & (ulong)local_140.m_lo |
                            (ulong)local_c8 & -(ulong)(local_c8 <= local_140.m_lo));
        dStack_110 = (double)(~-(ulong)(local_140.m_hi <= dStack_c0) & (ulong)local_140.m_hi |
                             (ulong)dStack_c0 & -(ulong)(local_140.m_hi <= dStack_c0));
        tcu::ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
        local_90.m_lo =
             (double)(~-(ulong)(local_f8 <= local_118) & (ulong)local_118 |
                     (ulong)local_f8 & -(ulong)(local_f8 <= local_118));
        local_90.m_hi =
             (double)(~-(ulong)(dStack_110 <= dStack_f0) & (ulong)dStack_110 |
                     (ulong)dStack_f0 & -(ulong)(dStack_110 <= dStack_f0));
      }
      else {
        local_90.m_lo = INFINITY;
        local_90.m_hi = -INFINITY;
        cVar6 = '\0';
      }
      local_90.m_hasNaN = (bool)cVar6;
      if (zi->m_hasNaN == true) {
        local_140.m_hasNaN = true;
        local_140.m_lo = INFINITY;
        local_140.m_hi = -INFINITY;
        tcu::Interval::operator|=(&local_90,&local_140);
      }
      cVar6 = '\x01';
      if (local_e0.m_hasNaN == false) {
        cVar6 = local_90.m_hasNaN;
      }
      dVar7 = (double)(~-(ulong)(local_e0.m_lo <= local_90.m_lo) & (ulong)local_90.m_lo |
                      (ulong)local_e0.m_lo & -(ulong)(local_e0.m_lo <= local_90.m_lo));
      dVar9 = (double)(~-(ulong)(local_90.m_hi <= local_e0.m_hi) & (ulong)local_90.m_hi |
                      (ulong)local_e0.m_hi & -(ulong)(local_90.m_hi <= local_e0.m_hi));
      __return_storage_ptr__ = local_98;
    }
    ctx = local_100;
    local_78.m_hasNaN = (bool)cVar6;
    local_78.m_lo = dVar7;
    local_78.m_hi = dVar9;
    if (yi->m_hasNaN == true) {
      local_140.m_hasNaN = true;
      local_140.m_lo = INFINITY;
      local_140.m_hi = -INFINITY;
      tcu::Interval::operator|=(&local_78,&local_140);
    }
    local_f8 = xi->m_hi;
    uVar5 = 0;
    local_e0.m_hasNaN = false;
    dVar7 = INFINITY;
    dVar9 = -INFINITY;
    local_e0.m_lo = INFINITY;
    local_e0.m_hi = -INFINITY;
    local_90.m_hasNaN = false;
    local_90.m_lo = INFINITY;
    local_90.m_hi = -INFINITY;
    dVar8 = yi->m_lo;
    if (dVar8 < yi->m_hi || dVar8 == yi->m_hi) {
      dVar7 = zi->m_lo;
      if (dVar7 < zi->m_hi || dVar7 == zi->m_hi) {
        local_128 = dVar7;
        local_118 = dVar8;
        point_ctx_.m_oldMode = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_f8,local_118,local_128,&local_140,this,ctx);
        bVar1 = local_140.m_hasNaN;
        local_a8 = local_140.m_lo;
        dStack_a0 = local_140.m_hi;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_f8,local_118,local_128,&local_140,this,ctx);
        bVar2 = local_140.m_hasNaN;
        local_b8 = local_140.m_lo;
        dStack_b0 = local_140.m_hi;
        tcu::ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
        local_128 = zi->m_hi;
        point_ctx_.m_oldMode = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        pEVar4 = local_100;
        local_98 = __return_storage_ptr__;
        (**(code **)(*(long *)this + 0x58))(local_f8,local_118,local_128,&local_140,this,local_100);
        uVar3 = local_140._0_4_;
        local_c8 = local_140.m_lo;
        dStack_c0 = local_140.m_hi;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_f8,local_118,local_128,&local_140,this,pEVar4);
        local_118 = (double)(~-(ulong)(local_a8 <= local_b8) & (ulong)local_b8 |
                            (ulong)local_a8 & -(ulong)(local_a8 <= local_b8));
        dStack_110 = (double)(~-(ulong)(dStack_b0 <= dStack_a0) & (ulong)dStack_b0 |
                             (ulong)dStack_a0 & -(ulong)(dStack_b0 <= dStack_a0));
        cVar6 = '\x01';
        if ((uVar3 & 1) == 0) {
          cVar6 = local_140.m_hasNaN;
        }
        if (((bVar1 | bVar2) & 1U) != 0) {
          cVar6 = '\x01';
        }
        local_128 = (double)(~-(ulong)(local_c8 <= local_140.m_lo) & (ulong)local_140.m_lo |
                            (ulong)local_c8 & -(ulong)(local_c8 <= local_140.m_lo));
        dStack_120 = (double)(~-(ulong)(local_140.m_hi <= dStack_c0) & (ulong)local_140.m_hi |
                             (ulong)dStack_c0 & -(ulong)(local_140.m_hi <= dStack_c0));
        tcu::ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
        local_e0.m_lo =
             (double)(~-(ulong)(local_118 <= local_128) & (ulong)local_128 |
                     (ulong)local_118 & -(ulong)(local_118 <= local_128));
        local_e0.m_hi =
             (double)(~-(ulong)(dStack_120 <= dStack_110) & (ulong)dStack_120 |
                     (ulong)dStack_110 & -(ulong)(dStack_120 <= dStack_110));
        __return_storage_ptr__ = local_98;
      }
      else {
        local_e0.m_lo = INFINITY;
        local_e0.m_hi = -INFINITY;
        cVar6 = '\0';
      }
      local_e0.m_hasNaN = (bool)cVar6;
      if (zi->m_hasNaN == true) {
        local_140.m_hasNaN = true;
        local_140.m_lo = INFINITY;
        local_140.m_hi = -INFINITY;
        tcu::Interval::operator|=(&local_e0,&local_140);
      }
      pEVar4 = local_100;
      dVar8 = zi->m_lo;
      if (dVar8 < zi->m_hi || dVar8 == zi->m_hi) {
        local_118 = yi->m_hi;
        local_128 = dVar8;
        point_ctx_.m_oldMode = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_f8,local_118,local_128,&local_140,this,pEVar4);
        bVar1 = local_140.m_hasNaN;
        local_a8 = local_140.m_lo;
        dStack_a0 = local_140.m_hi;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_f8,local_118,local_128,&local_140,this,pEVar4);
        bVar2 = local_140.m_hasNaN;
        local_b8 = local_140.m_lo;
        dStack_b0 = local_140.m_hi;
        tcu::ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
        local_128 = zi->m_hi;
        point_ctx_.m_oldMode = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_f8,local_118,local_128,&local_140,this,local_100);
        uVar3 = local_140._0_4_;
        local_c8 = local_140.m_lo;
        dStack_c0 = local_140.m_hi;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_f8,local_118,local_128,&local_140,this,local_100);
        local_f8 = (double)(~-(ulong)(local_a8 <= local_b8) & (ulong)local_b8 |
                           (ulong)local_a8 & -(ulong)(local_a8 <= local_b8));
        dStack_f0 = (double)(~-(ulong)(dStack_b0 <= dStack_a0) & (ulong)dStack_b0 |
                            (ulong)dStack_a0 & -(ulong)(dStack_b0 <= dStack_a0));
        uVar5 = 1;
        if ((uVar3 & 1) == 0) {
          uVar5 = local_140.m_hasNaN;
        }
        if (((bVar1 | bVar2) & 1U) != 0) {
          uVar5 = 1;
        }
        local_118 = (double)(~-(ulong)(local_c8 <= local_140.m_lo) & (ulong)local_140.m_lo |
                            (ulong)local_c8 & -(ulong)(local_c8 <= local_140.m_lo));
        dStack_110 = (double)(~-(ulong)(local_140.m_hi <= dStack_c0) & (ulong)local_140.m_hi |
                             (ulong)dStack_c0 & -(ulong)(local_140.m_hi <= dStack_c0));
        tcu::ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
        local_90.m_lo =
             (double)(~-(ulong)(local_f8 <= local_118) & (ulong)local_118 |
                     (ulong)local_f8 & -(ulong)(local_f8 <= local_118));
        local_90.m_hi =
             (double)(~-(ulong)(dStack_110 <= dStack_f0) & (ulong)dStack_110 |
                     (ulong)dStack_f0 & -(ulong)(dStack_110 <= dStack_f0));
      }
      else {
        local_90.m_lo = INFINITY;
        local_90.m_hi = -INFINITY;
        uVar5 = 0;
      }
      local_90.m_hasNaN = (bool)uVar5;
      if (zi->m_hasNaN == true) {
        local_140.m_hasNaN = true;
        local_140.m_lo = INFINITY;
        local_140.m_hi = -INFINITY;
        tcu::Interval::operator|=(&local_90,&local_140);
      }
      uVar5 = 1;
      if (local_e0.m_hasNaN == false) {
        uVar5 = local_90.m_hasNaN;
      }
      dVar7 = (double)(~-(ulong)(local_e0.m_lo <= local_90.m_lo) & (ulong)local_90.m_lo |
                      (ulong)local_e0.m_lo & -(ulong)(local_e0.m_lo <= local_90.m_lo));
      dVar9 = (double)(~-(ulong)(local_90.m_hi <= local_e0.m_hi) & (ulong)local_90.m_hi |
                      (ulong)local_e0.m_hi & -(ulong)(local_90.m_hi <= local_e0.m_hi));
      ctx = local_100;
    }
    local_48.m_hasNaN = (bool)uVar5;
    local_48.m_lo = dVar7;
    local_48.m_hi = dVar9;
    if (yi->m_hasNaN == true) {
      local_140.m_hasNaN = true;
      local_140.m_lo = INFINITY;
      local_140.m_hi = -INFINITY;
      tcu::Interval::operator|=(&local_48,&local_140);
      ctx = local_100;
    }
    uVar5 = 1;
    if (local_78.m_hasNaN == false) {
      uVar5 = local_48.m_hasNaN;
    }
    dVar8 = (double)(~-(ulong)(local_78.m_lo <= local_48.m_lo) & (ulong)local_48.m_lo |
                    (ulong)local_78.m_lo & -(ulong)(local_78.m_lo <= local_48.m_lo));
    dVar7 = (double)(~-(ulong)(local_48.m_hi <= local_78.m_hi) & (ulong)local_48.m_hi |
                    (ulong)local_78.m_hi & -(ulong)(local_48.m_hi <= local_78.m_hi));
  }
  local_60.m_hasNaN = (bool)uVar5;
  local_60.m_lo = dVar8;
  local_60.m_hi = dVar7;
  if (xi->m_hasNaN == true) {
    local_e0.m_hasNaN = true;
    local_e0.m_lo = INFINITY;
    local_e0.m_hi = -INFINITY;
    tcu::Interval::operator|=(&local_60,&local_e0);
  }
  tcu::FloatFormat::convert(__return_storage_ptr__,&ctx->format,&local_60);
  return __return_storage_ptr__;
}

Assistant:

Interval			applyMonotone	(const EvalContext&	ctx,
										 const Interval&	xi,
										 const Interval&	yi,
										 const Interval&	zi) const
	{
		Interval reti;
		TCU_INTERVAL_APPLY_MONOTONE3(reti, x, xi, y, yi, z, zi, ret,
									 TCU_SET_INTERVAL(ret, point,
													  point = this->applyPoint(ctx, x, y, z)));
		return ctx.format.convert(reti);
	}